

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleFans.h
# Opt level: O2

void __thiscall
o3dgc::TriangleFans::TriangleFans(TriangleFans *this,long sizeTFAN,long verticesSize)

{
  long *plVar1;
  
  if (sizeTFAN < 1) {
    __assert_fail("sizeTFAN > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/Open3DGC/o3dgcTriangleFans.h"
                  ,0xae,"o3dgc::TriangleFans::TriangleFans(long, long)");
  }
  if (0 < verticesSize) {
    this->m_numTFANs = 0;
    this->m_numVertices = 0;
    this->m_verticesAllocatedSize = verticesSize;
    this->m_sizeTFANAllocatedSize = sizeTFAN;
    plVar1 = (long *)operator_new__(-(ulong)((ulong)sizeTFAN >> 0x3d != 0) | sizeTFAN << 3);
    this->m_sizeTFAN = plVar1;
    plVar1 = (long *)operator_new__(-(ulong)((ulong)verticesSize >> 0x3d != 0) | verticesSize << 3);
    this->m_vertices = plVar1;
    return;
  }
  __assert_fail("verticesSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/Open3DGC/o3dgcTriangleFans.h"
                ,0xaf,"o3dgc::TriangleFans::TriangleFans(long, long)");
}

Assistant:

TriangleFans(long sizeTFAN     = O3DGC_TFANS_MIN_SIZE_TFAN_SIZE_BUFFER, 
                                                 long verticesSize = O3DGC_TFANS_MIN_SIZE_ALLOCATED_VERTICES_BUFFER)
                                    {
                                        assert(sizeTFAN     > 0);
                                        assert(verticesSize > 0);
                                        m_numTFANs              = 0;
                                        m_numVertices           = 0;
                                        m_verticesAllocatedSize = verticesSize;
                                        m_sizeTFANAllocatedSize = sizeTFAN;
                                        m_sizeTFAN              = new long [m_sizeTFANAllocatedSize];
                                        m_vertices              = new long [m_verticesAllocatedSize];
                                    }